

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_document * fy_parse_document_create(fy_parser *fyp,fy_eventp *fyep)

{
  fy_document_state *pfVar1;
  long lVar2;
  undefined4 uVar3;
  _Bool _Var4;
  fy_token *fyt;
  fy_diag *pfVar5;
  fy_accel *pfVar6;
  undefined1 local_68 [8];
  fy_diag_report_ctx _drc;
  int rc;
  fy_event *fye;
  fy_document_state *fyds;
  fy_document *fyd;
  fy_eventp *fyep_local;
  fy_parser *fyp_local;
  
  fyds = (fy_document_state *)0x0;
  if ((fyp == (fy_parser *)0x0) || (fyep == (fy_eventp *)0x0)) {
    return (fy_document *)0x0;
  }
  if ((fyep->e).type == FYET_DOCUMENT_START) {
    fyds = (fy_document_state *)malloc(0x98);
    if ((fy_document *)fyds == (fy_document *)0x0) {
      fy_parser_diag(fyp,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,0x17e,"fy_parse_document_create","malloc() failed");
    }
    else {
      memset(fyds,0,0x98);
      pfVar5 = fy_diag_ref(fyp->diag);
      ((fy_document *)fyds)->diag = pfVar5;
      (((fy_document *)fyds)->parse_cfg).search_path = (fyp->cfg).search_path;
      uVar3 = *(undefined4 *)&(fyp->cfg).field_0xc;
      (((fy_document *)fyds)->parse_cfg).flags = (fyp->cfg).flags;
      *(undefined4 *)&(((fy_document *)fyds)->parse_cfg).field_0xc = uVar3;
      (((fy_document *)fyds)->parse_cfg).userdata = (fyp->cfg).userdata;
      (((fy_document *)fyds)->parse_cfg).diag = (fyp->cfg).diag;
      fy_anchor_list_init(&((fy_document *)fyds)->anchors);
      _Var4 = fy_document_can_be_accelerated((fy_document *)fyds);
      if (!_Var4) {
LAB_00125608:
        ((fy_document *)fyds)->root = (fy_node *)0x0;
        pfVar1 = (fyep->e).field_1.document_start.document_state;
        (fyep->e).field_1.document_start.document_state = (fy_document_state *)0x0;
        fy_parse_eventp_recycle(fyp,fyep);
        fy_document_state_unref(((fy_document *)fyds)->fyds);
        ((fy_document *)fyds)->fyds = pfVar1;
        fy_document_list_init(&((fy_document *)fyds)->children);
        return (fy_document *)fyds;
      }
      pfVar6 = (fy_accel *)malloc(0x28);
      ((fy_document *)fyds)->axl = pfVar6;
      if (((fy_document *)fyds)->axl == (fy_accel *)0x0) {
        fy_parser_diag(fyp,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0x189,"fy_parse_document_create","malloc() failed");
      }
      else {
        _drc.override_column = fy_accel_setup(((fy_document *)fyds)->axl,&hd_anchor,fyds,8);
        if (_drc.override_column == 0) {
          pfVar6 = (fy_accel *)malloc(0x28);
          ((fy_document *)fyds)->naxl = pfVar6;
          if (((fy_document *)fyds)->axl == (fy_accel *)0x0) {
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                           ,0x192,"fy_parse_document_create","malloc() failed");
          }
          else {
            _drc.override_column = fy_accel_setup(((fy_document *)fyds)->naxl,&hd_nanchor,fyds,8);
            if (_drc.override_column == 0) {
              _drc.override_column = 0;
              goto LAB_00125608;
            }
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                           ,0x197,"fy_parse_document_create","fy_accel_setup() failed");
          }
        }
        else {
          fy_parser_diag(fyp,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0x18e,"fy_parse_document_create","fy_accel_setup() failed");
        }
      }
    }
  }
  else {
    memset(local_68,0,0x28);
    local_68._0_4_ = FYET_ERROR;
    local_68._4_4_ = FYEM_DOC;
    fyt = fy_document_event_get_token(&fyep->e);
    _drc._0_8_ = fy_token_ref(fyt);
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)local_68,"invalid start of event stream");
  }
  fy_parse_document_destroy(fyp,(fy_document *)fyds);
  fy_parse_eventp_recycle(fyp,fyep);
  lVar2 = *(long *)&(fyds->end_mark).line;
  *(byte *)(lVar2 + 0x3c) = *(byte *)(lVar2 + 0x3c) & 0xfe;
  return (fy_document *)0x0;
}

Assistant:

struct fy_document *fy_parse_document_create(struct fy_parser *fyp, struct fy_eventp *fyep) {
    struct fy_document *fyd = NULL;
    struct fy_document_state *fyds;
    struct fy_event *fye = NULL;
    int rc;

    if (!fyp || !fyep)
        return NULL;

    fye = &fyep->e;

    FYP_TOKEN_ERROR_CHECK(fyp, fy_document_event_get_token(fye), FYEM_DOC,
                          fye->type == FYET_DOCUMENT_START, err_out,
                          "invalid start of event stream");

    fyd = malloc(sizeof(*fyd));
    fyp_error_check(fyp, fyd, err_out,
                    "malloc() failed");

    memset(fyd, 0, sizeof(*fyd));

    fyd->diag = fy_diag_ref(fyp->diag);
    fyd->parse_cfg = fyp->cfg;

    fy_anchor_list_init(&fyd->anchors);
    if (fy_document_can_be_accelerated(fyd)) {
        fyd->axl = malloc(sizeof(*fyd->axl));
        fyp_error_check(fyp, fyd->axl, err_out,
                        "malloc() failed");

        /* start with a very small bucket list */
        rc = fy_accel_setup(fyd->axl, &hd_anchor, fyd, 8);
        fyp_error_check(fyp, !rc, err_out,
                        "fy_accel_setup() failed");

        fyd->naxl = malloc(sizeof(*fyd->naxl));
        fyp_error_check(fyp, fyd->axl, err_out,
                        "malloc() failed");

        /* start with a very small bucket list */
        rc = fy_accel_setup(fyd->naxl, &hd_nanchor, fyd, 8);
        fyp_error_check(fyp, !rc, err_out,
                        "fy_accel_setup() failed");
    }

    fyd->root = NULL;

    fyds = fye->document_start.document_state;
    fye->document_start.document_state = NULL;

    /* and we're done with this event */
    fy_parse_eventp_recycle(fyp, fyep);

    /* drop the old reference */
    fy_document_state_unref(fyd->fyds);

    /* note that we keep the reference */
    fyd->fyds = fyds;

    fy_document_list_init(&fyd->children);

    return fyd;

    err_out:
    fy_parse_document_destroy(fyp, fyd);
    fy_parse_eventp_recycle(fyp, fyep);
    fyd->diag->on_error = false;
    return NULL;
}